

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O3

uint Io_NtkWriteIntNode(FILE *pFile,Abc_Obj_t *pNode,int NodesOrPl)

{
  uint uVar1;
  Mio_Gate_t *pGate;
  int iVar2;
  Mio_Pin_t *pPin;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  
  if (pNode->pNtk->ntkFunc == ABC_FUNC_MAP) {
    pGate = (Mio_Gate_t *)(pNode->field_5).pData;
    pPin = Mio_GateReadPins(pGate);
    if (pPin == (Mio_Pin_t *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = 0;
      do {
        pcVar3 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar5]]
                            );
        fprintf((FILE *)pFile,"%s_",pcVar3);
        pPin = Mio_PinReadNext(pPin);
        lVar5 = lVar5 + 1;
      } while (pPin != (Mio_Pin_t *)0x0);
    }
    if ((int)lVar5 != (pNode->vFanins).nSize) {
      __assert_fail("i == Abc_ObjFaninNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                    ,0x183,"unsigned int Io_NtkWriteNodeGate(FILE *, Abc_Obj_t *)");
    }
    pcVar3 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    pcVar4 = Mio_GateReadName(pGate);
    fprintf((FILE *)pFile,"%s_%s\t",pcVar3,pcVar4);
    dVar7 = Mio_GateReadArea(pGate);
    uVar6 = (ulong)dVar7;
    if (NodesOrPl != 0) {
      return (uint)uVar6;
    }
  }
  else {
    if (0 < (pNode->vFanins).nSize) {
      lVar5 = 0;
      do {
        pcVar3 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar5]]
                            );
        fprintf((FILE *)pFile,"%s_",pcVar3);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (pNode->vFanins).nSize);
    }
    if (0 < (pNode->vFanouts).nSize) {
      lVar5 = 0;
      do {
        pcVar3 = Abc_ObjName((Abc_Obj_t *)
                             pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar5]]);
        fprintf((FILE *)pFile,"%s_",pcVar3);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (pNode->vFanouts).nSize);
    }
    fwrite("name\t",5,1,(FILE *)pFile);
    if (NodesOrPl != 0) {
      return 0;
    }
    uVar1 = (pNode->vFanins).nSize;
    iVar2 = Abc_NodeIsConst0(pNode);
    uVar6 = 0;
    if ((iVar2 == 0) && (iVar2 = Abc_NodeIsConst1(pNode), iVar2 == 0)) {
      iVar2 = Abc_NodeIsInv(pNode);
      uVar6 = 1;
      if (iVar2 == 0) {
        iVar2 = Abc_NodeIsBuf(pNode);
        uVar6 = 2;
        if (iVar2 == 0) {
          if (pNode->pNtk->ntkFunc != ABC_FUNC_SOP) {
            __assert_fail("Abc_NtkHasSop(pNode->pNtk)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                          ,0x13e,"unsigned int Io_NtkWriteIntNode(FILE *, Abc_Obj_t *, int)");
          }
          iVar2 = Abc_NodeIsNand2(pNode);
          if ((iVar2 == 0) && (iVar2 = Abc_NodeIsNor2(pNode), iVar2 == 0)) {
            iVar2 = Abc_NodeIsAnd2(pNode);
            uVar6 = 3;
            if ((iVar2 == 0) && (iVar2 = Abc_NodeIsOr2(pNode), iVar2 == 0)) {
              iVar2 = Abc_NodeIsXor2(pNode);
              uVar6 = 5;
              if ((iVar2 == 0) && (iVar2 = Abc_NodeIsXnor2(pNode), iVar2 == 0)) {
                if (uVar1 < 3) {
                  __assert_fail("isize > 2",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                                ,0x147,"unsigned int Io_NtkWriteIntNode(FILE *, Abc_Obj_t *, int)");
                }
                iVar2 = Abc_SopGetCubeNum((char *)(pNode->field_5).pData);
                uVar6 = (ulong)(iVar2 + uVar1);
              }
            }
          }
        }
      }
    }
  }
  fprintf((FILE *)pFile," %d %d\n",uVar6 & 0xffffffff,1);
  return (uint)uVar6;
}

Assistant:

unsigned Io_NtkWriteIntNode( FILE * pFile, Abc_Obj_t * pNode, int NodesOrPl )
{
    unsigned sizex=0, sizey=coreHeight, isize=0;
    //double nx, ny, xstep, ystep;    
    Abc_Obj_t * pNeti, *pNeto;
    int i;
        
    // write the network after mapping 
    if ( Abc_NtkHasMapping(pNode->pNtk) )
        sizex=Io_NtkWriteNodeGate( pFile, pNode );
    else
    {
    Abc_ObjForEachFanin( pNode, pNeti, i )
        fprintf( pFile, "%s_", Abc_ObjName(pNeti) );
    Abc_ObjForEachFanout( pNode, pNeto, i )
        fprintf( pFile, "%s_", Abc_ObjName(pNeto) );    
    fprintf( pFile, "name\t" );
    
    if(NodesOrPl == NODES)
    {
        isize=Abc_ObjFaninNum(pNode);
        if ( Abc_NodeIsConst0(pNode) || Abc_NodeIsConst1(pNode) ) 
            sizex=0;
        else if ( Abc_NodeIsInv(pNode) )
            sizex=1;
        else if ( Abc_NodeIsBuf(pNode) )
            sizex=2;
        else
        {
            assert( Abc_NtkHasSop(pNode->pNtk) );
            if ( Abc_NodeIsNand2(pNode) || Abc_NodeIsNor2(pNode) )
            sizex=2;
        else if ( Abc_NodeIsAnd2(pNode) || Abc_NodeIsOr2(pNode) )
            sizex=3;
        else if ( Abc_NodeIsXor2(pNode) || Abc_NodeIsXnor2(pNode) )
            sizex=5;
        else
        {
            assert( isize > 2 );
            sizex=isize+Abc_SopGetCubeNum((char *)pNode->pData);
        }
        }
    }
    }
    if(NodesOrPl == NODES)
    {
    fprintf( pFile, " %d %d\n", sizex, sizey );

    // Equally place pins. Size pins needs /  isize+#output+1
    isize= isize + Abc_ObjFanoutNum(pNode) + 1;
    }
    return sizex*sizey;
    /*
    xstep = sizex / isize;
    ystep = sizey / isize;
    nx= -0.5 * sizex;
    ny= -0.5 * sizey;

    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
            nx+= xstep;
            ny+= ystep;
            if (fabs(nx) < 0.001)
                    nx= 0;
            if (fabs(ny) < 0.001)
                    ny= 0;
    }
    Abc_ObjForEachFanout( pNode, pFanout, i )
    {
            nx+= xstep;
            ny+= ystep;
            if (fabs(nx) < 0.001)
                    nx= 0;
            if (fabs(ny) < 0.001)
                    ny= 0;
    }
    */
}